

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

bool __thiscall
duckdb::BitpackingState<duckdb::uhugeint_t,_duckdb::hugeint_t>::
Update<duckdb::EmptyBitpackingWriter>
          (BitpackingState<duckdb::uhugeint_t,_duckdb::hugeint_t> *this,uhugeint_t value,
          bool is_valid)

{
  uhugeint_t *puVar1;
  bool bVar2;
  idx_t iVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uhugeint_t local_58;
  uhugeint_t local_48;
  
  uVar4 = value.upper;
  uVar5 = value.lower;
  iVar3 = this->compression_buffer_idx;
  this->compression_buffer_validity[iVar3] = is_valid;
  this->all_valid = (bool)(this->all_valid & is_valid);
  this->all_invalid = (bool)(this->all_invalid & !is_valid);
  if (is_valid) {
    puVar1 = this->compression_buffer;
    puVar1[iVar3].lower = uVar5;
    puVar1[iVar3].upper = uVar4;
    local_48.lower = (this->minimum).lower;
    local_48.upper = (this->minimum).upper;
    local_58.lower = uVar5;
    local_58.upper = uVar4;
    bVar2 = uhugeint_t::operator<(&local_48,&local_58);
    uVar9 = (uint)bVar2;
    uVar6 = (int)(uVar9 << 0x1f) >> 0x1f;
    uVar7 = (int)(uVar9 << 0x1f) >> 0x1f;
    uVar8 = (int)(uVar9 << 0x1f) >> 0x1f;
    uVar9 = (int)(uVar9 << 0x1f) >> 0x1f;
    *(uint *)&(this->minimum).lower = uVar6 & (uint)local_48.lower | ~uVar6 & (uint)local_58.lower;
    *(uint *)((long)&(this->minimum).lower + 4) =
         uVar7 & local_48.lower._4_4_ | ~uVar7 & local_58.lower._4_4_;
    *(uint *)&(this->minimum).upper = uVar8 & (uint)local_48.upper | ~uVar8 & (uint)local_58.upper;
    *(uint *)((long)&(this->minimum).upper + 4) =
         uVar9 & local_48.upper._4_4_ | ~uVar9 & local_58.upper._4_4_;
    local_48.lower = (this->maximum).lower;
    local_48.upper = (this->maximum).upper;
    local_58.lower = uVar5;
    local_58.upper = uVar4;
    bVar2 = uhugeint_t::operator>(&local_48,&local_58);
    uVar9 = (uint)bVar2;
    uVar6 = (int)(uVar9 << 0x1f) >> 0x1f;
    uVar7 = (int)(uVar9 << 0x1f) >> 0x1f;
    uVar8 = (int)(uVar9 << 0x1f) >> 0x1f;
    uVar9 = (int)(uVar9 << 0x1f) >> 0x1f;
    *(uint *)&(this->maximum).lower = uVar6 & (uint)local_48.lower | ~uVar6 & (uint)local_58.lower;
    *(uint *)((long)&(this->maximum).lower + 4) =
         uVar7 & local_48.lower._4_4_ | ~uVar7 & local_58.lower._4_4_;
    *(uint *)&(this->maximum).upper = uVar8 & (uint)local_48.upper | ~uVar8 & (uint)local_58.upper;
    *(uint *)((long)&(this->maximum).upper + 4) =
         uVar9 & local_48.upper._4_4_ | ~uVar9 & local_58.upper._4_4_;
    iVar3 = this->compression_buffer_idx;
  }
  this->compression_buffer_idx = iVar3 + 1;
  bVar2 = true;
  if (iVar3 + 1 == 0x800) {
    bVar2 = Flush<duckdb::EmptyBitpackingWriter>(this);
    Reset(this);
  }
  return bVar2;
}

Assistant:

bool Update(T value, bool is_valid) {
		compression_buffer_validity[compression_buffer_idx] = is_valid;
		all_valid = all_valid && is_valid;
		all_invalid = all_invalid && !is_valid;

		if (is_valid) {
			compression_buffer[compression_buffer_idx] = value;
			minimum = MinValue<T>(minimum, value);
			maximum = MaxValue<T>(maximum, value);
		}

		compression_buffer_idx++;

		if (compression_buffer_idx == BITPACKING_METADATA_GROUP_SIZE) {
			bool success = Flush<OP>();
			Reset();
			return success;
		}
		return true;
	}